

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

void Memory::HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::GenerateValidPointersMap
               (ValidPointersMapTable *validTable,InvalidBitsTable *invalidTable,
               BlockInfoMapTable *blockInfoTable)

{
  SmallHeapBlockBitVector *this;
  SmallHeapBlockBitVector *pSVar1;
  BlockInfo *pBVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Type *pTVar10;
  undefined1 auVar11 [16];
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ushort uVar15;
  uint uVar16;
  long lVar17;
  ushort uVar18;
  BVIndex i;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  ValidPointersMapTable *paauVar26;
  ushort *puVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar37 [16];
  undefined1 in_XMM5 [16];
  undefined1 in_XMM6 [16];
  undefined1 in_XMM7 [16];
  undefined1 in_XMM8 [16];
  long local_60;
  long local_50;
  ulong local_38;
  
  if (validTable != (ValidPointersMapTable *)0x0) {
    memset(validTable,0xff,0xc000);
  }
  local_38 = 1;
  local_50 = 2;
  local_60 = 0x10;
  lVar17 = -1;
  uVar24 = 0;
  do {
    uVar14 = ~uVar24;
    puVar27 = (*validTable)[0] + 0x100;
    if (validTable == (ValidPointersMapTable *)0x0) {
      puVar27 = (ushort *)0x0;
    }
    this = *invalidTable + uVar24;
    pTVar10 = (*invalidTable)[uVar24].data;
    *(undefined4 *)&pTVar10[2].word = 0xffffffff;
    *(undefined4 *)((long)&pTVar10[2].word + 4) = 0xffffffff;
    *(undefined4 *)&pTVar10[3].word = 0xffffffff;
    *(undefined4 *)((long)&pTVar10[3].word + 4) = 0xffffffff;
    pSVar1 = *invalidTable + uVar24;
    *(undefined4 *)&pSVar1->data[0].word = 0xffffffff;
    *(undefined4 *)((long)&pSVar1->data[0].word + 4) = 0xffffffff;
    *(undefined4 *)&pSVar1->data[1].word = 0xffffffff;
    *(undefined4 *)((long)&pSVar1->data[1].word + 4) = 0xffffffff;
    iVar13 = (int)uVar24;
    pBVar2 = (*blockInfoTable)[uVar24];
    uVar24 = uVar24 + 1;
    uVar3 = 0x1000 / (iVar13 * 0x10 + 0x10U & 0xffff);
    pBVar2->lastObjectIndexOnPage = 0;
    pBVar2->pageObjectCount = 0;
    uVar28 = 0;
    lVar25 = 0;
    uVar16 = 0;
    paauVar26 = validTable;
    do {
      i = (BVIndex)lVar25;
      uVar15 = (ushort)uVar16;
      if (validTable != (ValidPointersMapTable *)0x0) {
        i = uVar16 * (int)uVar24;
        (*paauVar26)[0][0] = uVar15;
      }
      uVar12 = uVar28 >> 0xc & 0xfffff;
      pBVar2[uVar12].pageObjectCount = pBVar2[uVar12].pageObjectCount + 1;
      if (uVar15 <= pBVar2[uVar12].lastObjectIndexOnPage) {
        uVar15 = pBVar2[uVar12].lastObjectIndexOnPage;
      }
      pBVar2[uVar12].lastObjectIndexOnPage = uVar15;
      BVStatic<256UL>::Clear(this,i);
      auVar11 = _DAT_00fa8550;
      uVar16 = uVar16 + 1;
      lVar25 = lVar25 + local_38;
      paauVar26 = (ValidPointersMapTable *)((long)(*paauVar26)[0] + local_50);
      uVar28 = uVar28 + local_60;
      in_XMM5 = pmovsxbq(in_XMM5,0x706);
      in_XMM6 = pmovsxbq(in_XMM6,0x504);
      in_XMM7 = pmovsxbq(in_XMM7,0x302);
      in_XMM8 = pmovsxbq(in_XMM8,0x100);
    } while (uVar16 < uVar3);
    if (puVar27 == (ushort *)0x0) {
      validTable = (ValidPointersMapTable *)0x0;
    }
    else {
      validTable = (ValidPointersMapTable *)(puVar27 + 0x100);
      puVar27 = puVar27 + 7;
      uVar12 = 1;
      lVar25 = 7;
      lVar19 = 0;
      lVar23 = 0;
      uVar28 = local_38;
      do {
        uVar20 = 0x100;
        if (uVar28 < 0x100) {
          uVar20 = uVar28;
        }
        if (uVar20 <= uVar12) {
          uVar20 = uVar12;
        }
        if ((uint)((int)lVar19 * (int)uVar24) < 0x100) {
          uVar21 = local_38 + lVar23;
          if (0xff < uVar21) {
            uVar21 = 0x100;
          }
          if (uVar21 <= lVar23 + 1U) {
            uVar21 = lVar23 + 1U;
          }
          lVar22 = uVar21 + lVar19 * uVar14 + -1;
          auVar29._8_4_ = (int)lVar22;
          auVar29._0_8_ = lVar22;
          auVar29._12_4_ = (int)((ulong)lVar22 >> 0x20);
          uVar21 = 0;
          do {
            auVar31._8_4_ = (int)uVar21;
            auVar31._0_8_ = uVar21;
            auVar31._12_4_ = (int)(uVar21 >> 0x20);
            auVar33 = (auVar31 | in_XMM8) ^ auVar11;
            lVar22 = SUB168(auVar29 ^ auVar11,0);
            auVar34._0_8_ = -(ulong)(lVar22 < auVar33._0_8_);
            lVar30 = SUB168(auVar29 ^ auVar11,8);
            auVar34._8_8_ = -(ulong)(lVar30 < auVar33._8_8_);
            auVar37 = pshuflw(in_XMM3,auVar34,0xe8);
            auVar33._8_4_ = 0xffffffff;
            auVar33._0_8_ = 0xffffffffffffffff;
            auVar33._12_4_ = 0xffffffff;
            auVar33 = packssdw(auVar37 ^ auVar33,auVar37 ^ auVar33);
            uVar18 = (ushort)lVar19;
            if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar27[uVar21 - 7] = uVar18;
            }
            auVar34 = packssdw(auVar34,auVar34);
            auVar37._8_4_ = 0xffffffff;
            auVar37._0_8_ = 0xffffffffffffffff;
            auVar37._12_4_ = 0xffffffff;
            auVar34 = packssdw(auVar34 ^ auVar37,auVar34 ^ auVar37);
            if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              puVar27[uVar21 - 6] = uVar18;
            }
            auVar34 = (auVar31 | in_XMM7) ^ auVar11;
            auVar35._0_8_ = -(ulong)(lVar22 < auVar34._0_8_);
            auVar35._8_8_ = -(ulong)(lVar30 < auVar34._8_8_);
            auVar33 = packssdw(auVar33,auVar35);
            auVar4._8_4_ = 0xffffffff;
            auVar4._0_8_ = 0xffffffffffffffff;
            auVar4._12_4_ = 0xffffffff;
            auVar33 = packssdw(auVar33 ^ auVar4,auVar33 ^ auVar4);
            if ((auVar33 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar27[uVar21 - 5] = uVar18;
            }
            auVar34 = pshufhw(auVar35,auVar35,0x84);
            auVar5._8_4_ = 0xffffffff;
            auVar5._0_8_ = 0xffffffffffffffff;
            auVar5._12_4_ = 0xffffffff;
            auVar34 = packssdw(auVar34 ^ auVar5,auVar34 ^ auVar5);
            if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar27[uVar21 - 4] = uVar18;
            }
            auVar34 = (auVar31 | in_XMM6) ^ auVar11;
            auVar36._0_8_ = -(ulong)(lVar22 < auVar34._0_8_);
            auVar36._8_8_ = -(ulong)(lVar30 < auVar34._8_8_);
            auVar33 = pshuflw(auVar33,auVar36,0xe8);
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            in_XMM3 = packssdw(auVar33 ^ auVar6,auVar33 ^ auVar6);
            if ((in_XMM3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar27[uVar21 - 3] = uVar18;
            }
            auVar33 = packssdw(auVar36,auVar36);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            auVar33 = packssdw(auVar33 ^ auVar7,auVar33 ^ auVar7);
            if ((auVar33 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              puVar27[uVar21 - 2] = uVar18;
            }
            auVar31 = (auVar31 | in_XMM5) ^ auVar11;
            auVar32._0_8_ = -(ulong)(lVar22 < auVar31._0_8_);
            auVar32._8_8_ = -(ulong)(lVar30 < auVar31._8_8_);
            auVar33 = packssdw(auVar33,auVar32);
            auVar8._8_4_ = 0xffffffff;
            auVar8._0_8_ = 0xffffffffffffffff;
            auVar8._12_4_ = 0xffffffff;
            auVar33 = packssdw(auVar33 ^ auVar8,auVar33 ^ auVar8);
            if ((auVar33 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar27[uVar21 - 1] = uVar18;
            }
            auVar33 = pshufhw(auVar32,auVar32,0x84);
            auVar9._8_4_ = 0xffffffff;
            auVar9._0_8_ = 0xffffffffffffffff;
            auVar9._12_4_ = 0xffffffff;
            auVar33 = packssdw(auVar33 ^ auVar9,auVar33 ^ auVar9);
            if ((auVar33 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar27[uVar21] = uVar18;
            }
            uVar21 = uVar21 + 8;
          } while ((uVar20 + lVar25 & 0xfffffffffffffff8) != uVar21);
        }
        lVar19 = lVar19 + 1;
        lVar23 = lVar23 + local_38;
        uVar28 = uVar28 + local_38;
        uVar12 = uVar12 + local_38;
        lVar25 = lVar25 + lVar17;
        puVar27 = (ushort *)((long)puVar27 + local_50);
      } while ((uint)lVar19 < uVar3);
    }
    local_38 = local_38 + 1;
    local_50 = local_50 + 2;
    local_60 = local_60 + 0x10;
    lVar17 = lVar17 + -1;
  } while (uVar24 != 0x30);
  return;
}

Assistant:

void HeapInfo::ValidPointersMap<TBlockAttributes>::GenerateValidPointersMap(ValidPointersMapTable * validTable, InvalidBitsTable& invalidTable, BlockInfoMapTable& blockInfoTable)
{
    // Create the valid pointer map to be shared by the buckets.
    // Also create the invalid objects bit vector.
    ushort * buffer = &((*validTable)[0][0]);
    if (buffer)
    {
        memset(buffer, -1, sizeof(ushort) * 2 * TBlockAttributes::MaxSmallObjectCount * TBlockAttributes::BucketCount);
    }

    for (uint i = 0; i < TBlockAttributes::BucketCount; i++)
    {
        // Non-interior first
        ushort * validPointers = buffer;
        if (buffer)
        {            
            buffer += TBlockAttributes::MaxSmallObjectCount;
        }

        typename SmallHeapBlockT<TBlockAttributes>::SmallHeapBlockBitVector * invalidBitVector = &invalidTable[i];
        invalidBitVector->SetAll();

        uint bucketSize;

        if (TBlockAttributes::IsSmallBlock)
        {
            bucketSize = TBlockAttributes::MinObjectSize + HeapConstants::ObjectGranularity * i;
        }
        else
        {
            bucketSize = TBlockAttributes::MinObjectSize + HeapConstants::MediumObjectGranularity * (i + 1);
        }

        uint stride = bucketSize / HeapConstants::ObjectGranularity;
        uint maxObjectCountForBucket = ((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucketSize);

        BlockInfoMapRow* blockInfoRow = &blockInfoTable[i];

        memset(blockInfoRow, 0, sizeof(BlockInfoMapRow));

        for (ushort j = 0; j < maxObjectCountForBucket; j++)
        {
            if (validPointers)
            {
                validPointers[j * stride] = j;
            }

            uintptr_t objectAddress = j * bucketSize;
            Assert(objectAddress / AutoSystemInfo::PageSize < USHRT_MAX);
            ushort pageIndex = (ushort)(objectAddress / AutoSystemInfo::PageSize);

            (*blockInfoRow)[pageIndex].pageObjectCount++;
            (*blockInfoRow)[pageIndex].lastObjectIndexOnPage = max(j, (*blockInfoRow)[pageIndex].lastObjectIndexOnPage);

            invalidBitVector->Clear(j * stride);
        }

        if (buffer)
        {
            // interior pointer
            ushort * validInteriorPointers = buffer;
            buffer += TBlockAttributes::MaxSmallObjectCount;
            for (ushort j = 0; j < maxObjectCountForBucket; j++)
            {
                uint start = j * stride;
                uint end = min(start + stride, TBlockAttributes::MaxSmallObjectCount);
                for (uint k = start; k < end; k++)
                {
                    validInteriorPointers[k] = j;
                }
            }
        }
    }
}